

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanImplX11.cpp
# Opt level: O0

bool sf::priv::VulkanImplX11::isAvailable(bool requireGraphics)

{
  byte bVar1;
  bool bVar2;
  bool bVar3;
  code *pcVar4;
  bool bVar5;
  int iVar6;
  reference pvVar7;
  iterator this;
  pointer pVVar8;
  byte in_DIL;
  const_iterator iter;
  bool has_VK_KHR_platform_surface;
  bool has_VK_KHR_surface;
  uint32_t extensionCount;
  vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_> extensionProperties;
  VulkanLibraryWrapper *in_stack_ffffffffffffff98;
  __normal_iterator<const_VkExtensionProperties_*,_std::vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>_>
  *this_00;
  size_type in_stack_ffffffffffffffb8;
  __normal_iterator<const_VkExtensionProperties_*,_std::vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>_>
  in_stack_ffffffffffffffc0;
  undefined4 local_24;
  vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_> local_20;
  byte local_2;
  bool local_1;
  
  local_2 = in_DIL & 1;
  if (!isAvailable::checked) {
    isAvailable::checked = true;
    isAvailable::computeAvailable =
         anon_unknown.dwarf_26467c::VulkanLibraryWrapper::loadLibrary(in_stack_ffffffffffffff98);
    isAvailable::graphicsAvailable = isAvailable::computeAvailable;
    if (isAvailable::computeAvailable) {
      std::vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>::vector
                ((vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_> *)0x2fa1da);
      local_24 = 0;
      (*_DAT_0049b4b8)(0,&local_24);
      std::vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>::resize
                ((vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_> *)
                 in_stack_ffffffffffffffc0._M_current,in_stack_ffffffffffffffb8);
      pcVar4 = _DAT_0049b4b8;
      this_00 = (__normal_iterator<const_VkExtensionProperties_*,_std::vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>_>
                 *)0x0;
      pvVar7 = std::vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>::
               operator[](&local_20,0);
      (*pcVar4)(this_00,&local_24,pvVar7);
      bVar2 = false;
      bVar3 = false;
      std::vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>::begin
                ((vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_> *)
                 in_stack_ffffffffffffff98);
      __gnu_cxx::
      __normal_iterator<VkExtensionProperties_const*,std::vector<VkExtensionProperties,std::allocator<VkExtensionProperties>>>
      ::__normal_iterator<VkExtensionProperties*>
                (this_00,(__normal_iterator<VkExtensionProperties_*,_std::vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>_>
                          *)in_stack_ffffffffffffff98);
      while( true ) {
        this = std::vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>::end
                         ((vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_> *)
                          in_stack_ffffffffffffff98);
        bVar5 = __gnu_cxx::operator!=
                          (this_00,(__normal_iterator<VkExtensionProperties_*,_std::vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>_>
                                    *)in_stack_ffffffffffffff98);
        if (!bVar5) break;
        pVVar8 = __gnu_cxx::
                 __normal_iterator<const_VkExtensionProperties_*,_std::vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>_>
                 ::operator->((__normal_iterator<const_VkExtensionProperties_*,_std::vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>_>
                               *)&stack0xffffffffffffffc0);
        iVar6 = strcmp(pVVar8->extensionName,"VK_KHR_surface");
        if (iVar6 == 0) {
          bVar2 = true;
        }
        else {
          pVVar8 = __gnu_cxx::
                   __normal_iterator<const_VkExtensionProperties_*,_std::vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>_>
                   ::operator->((__normal_iterator<const_VkExtensionProperties_*,_std::vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>_>
                                 *)&stack0xffffffffffffffc0);
          iVar6 = strcmp(pVVar8->extensionName,"VK_KHR_xlib_surface");
          if (iVar6 == 0) {
            bVar3 = true;
          }
        }
        __gnu_cxx::
        __normal_iterator<const_VkExtensionProperties_*,_std::vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>_>
        ::operator++((__normal_iterator<const_VkExtensionProperties_*,_std::vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>_>
                      *)&stack0xffffffffffffffc0);
      }
      if ((!bVar2) || (!bVar3)) {
        isAvailable::graphicsAvailable = false;
      }
      std::vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>::~vector
                ((vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_> *)
                 this._M_current);
    }
  }
  bVar1 = isAvailable::computeAvailable;
  if ((local_2 & 1) != 0) {
    bVar1 = isAvailable::graphicsAvailable;
  }
  local_1 = (bool)(bVar1 & 1);
  return local_1;
}

Assistant:

bool VulkanImplX11::isAvailable(bool requireGraphics)
{
    static bool checked = false;
    static bool computeAvailable = false;
    static bool graphicsAvailable = false;

    if (!checked)
    {
        checked = true;

        // Check if the library is available
        computeAvailable = wrapper.loadLibrary();

        // To check for instance extensions we don't need to differentiate between graphics and compute
        graphicsAvailable = computeAvailable;

        if (graphicsAvailable)
        {
            // Retrieve the available instance extensions
            std::vector<VkExtensionProperties> extensionProperties;

            uint32_t extensionCount = 0;

            wrapper.vkEnumerateInstanceExtensionProperties(0, &extensionCount, NULL);

            extensionProperties.resize(extensionCount);

            wrapper.vkEnumerateInstanceExtensionProperties(0, &extensionCount, &extensionProperties[0]);

            // Check if the necessary extensions are available
            bool has_VK_KHR_surface = false;
            bool has_VK_KHR_platform_surface = false;

            for (std::vector<VkExtensionProperties>::const_iterator iter = extensionProperties.begin(); iter != extensionProperties.end(); ++iter)
            {
                if (!std::strcmp(iter->extensionName, VK_KHR_SURFACE_EXTENSION_NAME))
                {
                    has_VK_KHR_surface = true;
                }
                else if (!std::strcmp(iter->extensionName, VK_KHR_XLIB_SURFACE_EXTENSION_NAME))
                {
                    has_VK_KHR_platform_surface = true;
                }
            }

            if (!has_VK_KHR_surface || !has_VK_KHR_platform_surface)
                graphicsAvailable = false;
        }
    }

    if (requireGraphics)
        return graphicsAvailable;

    return computeAvailable;
}